

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

void rtext_activate(_rtext *x,int state)

{
  undefined1 *puVar1;
  _glist *p_Var2;
  t_editor *ptVar3;
  _glist *in_RAX;
  _glist *p_Var4;
  int iVar5;
  int h;
  int w;
  int indx;
  int local_2c [3];
  
  local_2c[1] = 0;
  local_2c[0] = 0;
  p_Var2 = x->x_glist;
  p_Var4 = glist_getcanvas(in_RAX);
  if (state == 0) {
    pdgui_vmess("pdtk_text_editing","^si",p_Var4,"",0);
    ptVar3 = p_Var2->gl_editor;
    iVar5 = 0;
    if (ptVar3->e_textedfor == x) {
      ptVar3->e_textedfor = (_rtext *)0x0;
      iVar5 = 0;
    }
  }
  else {
    pdgui_vmess("pdtk_text_editing","^si",p_Var4,x->x_tag,1);
    ptVar3 = p_Var2->gl_editor;
    ptVar3->e_textedfor = x;
    puVar1 = &ptVar3->field_0x88;
    *puVar1 = *puVar1 & 0xef;
    x->x_selstart = 0;
    x->x_dragfrom = 0;
    x->x_selend = x->x_bufsize;
    iVar5 = 1;
  }
  x->x_active = iVar5;
  rtext_senditup(x,2,local_2c + 1,local_2c,local_2c + 2);
  return;
}

Assistant:

void rtext_activate(t_rtext *x, int state)
{
    int w = 0, h = 0, indx;
    t_glist *glist = x->x_glist;
    t_canvas *canvas = glist_getcanvas(glist);
    if (state)
    {
        pdgui_vmess("pdtk_text_editing", "^si", canvas, x->x_tag, 1);
        glist->gl_editor->e_textedfor = x;
        glist->gl_editor->e_textdirty = 0;
        x->x_dragfrom = x->x_selstart = 0;
        x->x_selend = x->x_bufsize;
        x->x_active = 1;
    }
    else
    {
        pdgui_vmess("pdtk_text_editing", "^si", canvas, "", 0);
        if (glist->gl_editor->e_textedfor == x)
            glist->gl_editor->e_textedfor = 0;
        x->x_active = 0;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}